

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O2

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::insert
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  uint uVar1;
  VIterator puVar2;
  reference __v;
  pair<llvm::NoneType,_bool> pVar3;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar4;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    puVar2 = vfind(this,V);
    uVar1 = (this->Vector).super_SmallVectorImpl<unsigned_int>.
            super_SmallVectorTemplateBase<unsigned_int,_true>.
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
    if (puVar2 == (VIterator)
                  ((ulong)uVar1 * 4 +
                  (long)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                        super_SmallVectorTemplateBase<unsigned_int,_true>.
                        super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.
                        BeginX)) {
      pVar3.first = None;
      pVar3.second = true;
      pVar3._5_3_ = 0;
      if (uVar1 < 5) {
        SmallVectorTemplateBase<unsigned_int,_true>::push_back
                  ((SmallVectorTemplateBase<unsigned_int,_true> *)this,V);
      }
      else {
        uVar1 = 1;
        while (uVar1 != 0) {
          __v = SmallVectorTemplateCommon<unsigned_int,_void>::back
                          ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&this->Set,__v);
          SmallVectorTemplateBase<unsigned_int,_true>::pop_back
                    ((SmallVectorTemplateBase<unsigned_int,_true> *)this);
          uVar1 = (this->Vector).super_SmallVectorImpl<unsigned_int>.
                  super_SmallVectorTemplateBase<unsigned_int,_true>.
                  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
        }
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&this->Set,V);
      }
    }
    else {
      pVar3.first = None;
      pVar3.second = false;
      pVar3._5_3_ = 0;
    }
  }
  else {
    pVar4 = std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&this->Set,V);
    pVar3 = (pair<llvm::NoneType,_bool>)(((ulong)pVar4.second << 0x20) + 1);
  }
  return pVar3;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }